

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

size_t GetStrSize(char *str,size_t charBytes)

{
  int *local_40;
  UINT32 *ptr_1;
  UINT32 *u32str;
  UINT16 *ptr;
  UINT16 *u16str;
  size_t charBytes_local;
  char *str_local;
  
  if (charBytes == 1) {
    str_local = (char *)strlen(str);
  }
  else {
    u32str = (UINT32 *)str;
    if (charBytes == 2) {
      for (; (short)*u32str != 0; u32str = (UINT32 *)((long)u32str + 2)) {
      }
      str_local = (char *)(((long)u32str - (long)str >> 1) * 2);
    }
    else {
      local_40 = (int *)str;
      if (charBytes == 4) {
        for (; *local_40 != 0; local_40 = local_40 + 1) {
        }
        str_local = (char *)(((long)local_40 - (long)str >> 2) * 4);
      }
      else {
        str_local = (char *)0x0;
      }
    }
  }
  return (size_t)str_local;
}

Assistant:

static size_t GetStrSize(const char* str, size_t charBytes)
{
	if (charBytes == 1)
	{
		return strlen(str) * charBytes;
	}
	else if (charBytes == 2)
	{
		const UINT16* u16str = (const UINT16*)str;
		const UINT16* ptr;
		for (ptr = u16str; *ptr != 0; ptr ++)
			;
		return (ptr - u16str) * charBytes;
	}
	else if (charBytes == 4)
	{
		const UINT32* u32str = (const UINT32*)str;
		const UINT32* ptr;
		for (ptr = u32str; *ptr != 0; ptr ++)
			;
		return (ptr - u32str) * charBytes;
	}
	return 0;
}